

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O0

void deqp::gls::ShaderExecUtil::BufferIoExecutor::copyFromBuffer
               (VarType *varType,VarLayout *layout,int numValues,void *srcBasePtr,void *dstBasePtr)

{
  bool bVar1;
  InternalError *this;
  int local_ac;
  int local_a4;
  allocator<char> local_89;
  string local_88;
  void *local_68;
  deUint8 *dstPtr;
  deUint8 *srcPtr;
  int local_50;
  int dstOffset;
  int srcOffset;
  int vecNdx;
  int elemNdx;
  int numComps;
  int numVecs;
  int scalarSize;
  bool isMatrix;
  void *pvStack_30;
  DataType basicType;
  void *dstBasePtr_local;
  void *srcBasePtr_local;
  VarLayout *pVStack_18;
  int numValues_local;
  VarLayout *layout_local;
  VarType *varType_local;
  
  pvStack_30 = dstBasePtr;
  dstBasePtr_local = srcBasePtr;
  srcBasePtr_local._4_4_ = numValues;
  pVStack_18 = layout;
  layout_local = (VarLayout *)varType;
  bVar1 = glu::VarType::isBasicType(varType);
  if (!bVar1) {
    this = (InternalError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"Unsupported type",&local_89);
    tcu::InternalError::InternalError(this,&local_88);
    __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
  }
  scalarSize = glu::VarType::getBasicType((VarType *)layout_local);
  numVecs._3_1_ = glu::isDataTypeMatrix(scalarSize);
  numComps = glu::getDataTypeScalarSize(scalarSize);
  if ((numVecs._3_1_ & 1) == 0) {
    local_a4 = 1;
  }
  else {
    local_a4 = glu::getDataTypeMatrixNumColumns(scalarSize);
  }
  elemNdx = local_a4;
  vecNdx = numComps / local_a4;
  for (srcOffset = 0; srcOffset < srcBasePtr_local._4_4_; srcOffset = srcOffset + 1) {
    for (dstOffset = 0; dstOffset < elemNdx; dstOffset = dstOffset + 1) {
      if ((numVecs._3_1_ & 1) == 0) {
        local_ac = 0;
      }
      else {
        local_ac = pVStack_18->matrixStride * dstOffset;
      }
      local_50 = pVStack_18->offset + pVStack_18->stride * srcOffset + local_ac;
      srcPtr._4_4_ = (srcOffset * numComps + dstOffset * vecNdx) * 4;
      dstPtr = (deUint8 *)((long)dstBasePtr_local + (long)local_50);
      local_68 = (void *)((long)pvStack_30 + (long)srcPtr._4_4_);
      ::deMemcpy(local_68,dstPtr,(long)vecNdx << 2);
    }
  }
  return;
}

Assistant:

void BufferIoExecutor::copyFromBuffer (const glu::VarType& varType, const VarLayout& layout, int numValues, const void* srcBasePtr, void* dstBasePtr)
{
	if (varType.isBasicType())
	{
		const glu::DataType		basicType		= varType.getBasicType();
		const bool				isMatrix		= glu::isDataTypeMatrix(basicType);
		const int				scalarSize		= glu::getDataTypeScalarSize(basicType);
		const int				numVecs			= isMatrix ? glu::getDataTypeMatrixNumColumns(basicType) : 1;
		const int				numComps		= scalarSize / numVecs;

		for (int elemNdx = 0; elemNdx < numValues; elemNdx++)
		{
			for (int vecNdx = 0; vecNdx < numVecs; vecNdx++)
			{
				const int		srcOffset		= layout.offset + layout.stride*elemNdx + (isMatrix ? layout.matrixStride*vecNdx : 0);
				const int		dstOffset		= (int)sizeof(deUint32)*(elemNdx*scalarSize + vecNdx*numComps);
				const deUint8*	srcPtr			= (const deUint8*)srcBasePtr + srcOffset;
				deUint8*		dstPtr			= (deUint8*)dstBasePtr + dstOffset;

				deMemcpy(dstPtr, srcPtr, sizeof(deUint32)*numComps);
			}
		}
	}
	else
		throw tcu::InternalError("Unsupported type");
}